

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Frac.hpp
# Opt level: O1

Frac<scp::BigInt<unsigned_int,_unsigned_long>_> * __thiscall
scp::Frac<scp::BigInt<unsigned_int,_unsigned_long>_>::operator+=
          (Frac<scp::BigInt<unsigned_int,_unsigned_long>_> *this,
          Frac<scp::BigInt<unsigned_int,_unsigned_long>_> *x)

{
  BigInt<unsigned_int,_unsigned_long> *y;
  BigInt<unsigned_int,_unsigned_long> q;
  BigInt<unsigned_int,_unsigned_long> p;
  BigInt<unsigned_int,_unsigned_long> local_88;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_68;
  bool local_50;
  BigInt<unsigned_int,_unsigned_long> local_48;
  
  operator*(&local_88,&this->_p,&x->_q);
  y = &this->_q;
  operator*(&local_48,&x->_p,y);
  BigInt<unsigned_int,_unsigned_long>::operator+=(&local_88,&local_48);
  local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_88._values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_88._values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_88._values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_88._values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88._values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88._values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_50 = local_88._positive;
  if (local_48._values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48._values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48._values.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48._values.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_88._values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88._values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_88._values.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_88._values.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  operator*(&local_88,y,&x->_q);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(&(this->_p)._values,&local_68)
  ;
  (this->_p)._positive = local_50;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(&y->_values,&local_88._values)
  ;
  (this->_q)._positive = local_88._positive;
  _simplify(this);
  if (local_88._values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88._values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_88._values.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_88._values.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return this;
}

Assistant:

constexpr Frac<TValue>& Frac<TValue>::operator+=(const Frac<TValue>& x)
	{
		const TValue p = _p * x._q + x._p * _q;
		const TValue q = _q * x._q;

		_p = p;
		_q = q;

		_simplify();

		return *this;
	}